

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O2

void __thiscall CDirectiveSkip::writeTempData(CDirectiveSkip *this,TempData *tempData)

{
  int64_t memoryAddress;
  string sStack_38;
  
  memoryAddress = this->virtualAddress;
  tinyformat::format<long>(&sStack_38,".skip 0x%08X",&this->value);
  TempData::writeLine(tempData,memoryAddress,&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void CDirectiveSkip::writeTempData(TempData& tempData) const
{
	tempData.writeLine(virtualAddress,tfm::format(".skip 0x%08X",value));
}